

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<bool>::RepeatedField
          (RepeatedField<bool> *this,Arena *arena,RepeatedField<bool> *rhs)

{
  bool is_soo_00;
  int new_size;
  bool *src;
  bool *dst;
  undefined1 local_29;
  bool is_soo;
  int size;
  bool rhs_is_soo;
  RepeatedField<bool> *rhs_local;
  Arena *arena_local;
  RepeatedField<bool> *this_local;
  
  internal::SooRep::SooRep(&this->soo_rep_,arena);
  AnnotateSize(this,3,0);
  is_soo_00 = RepeatedField<bool>::is_soo(rhs);
  new_size = RepeatedField<bool>::size(rhs,is_soo_00);
  if (new_size != 0) {
    if (3 < new_size) {
      Grow(this,true,0,new_size);
    }
    local_29 = 3 >= new_size;
    ExchangeCurrentSize(this,local_29,new_size);
    src = elements(rhs,is_soo_00);
    dst = unsafe_elements(this,local_29);
    UninitializedCopyN(src,new_size,dst);
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(Arena* arena,
                                             const RepeatedField& rhs)
    : soo_rep_(arena) {
  StaticValidityCheck();
  AnnotateSize(kSooCapacityElements, 0);
  const bool rhs_is_soo = rhs.is_soo();
  if (auto size = rhs.size(rhs_is_soo)) {
    bool is_soo = true;
    if (size > kSooCapacityElements) {
      Grow(is_soo, 0, size);
      is_soo = false;
    }
    ExchangeCurrentSize(is_soo, size);
    UninitializedCopyN(rhs.elements(rhs_is_soo), size, unsafe_elements(is_soo));
  }
}